

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O2

string * __thiscall
vkt::SpirVAssembly::getNumberTypeName_abi_cxx11_
          (string *__return_storage_ptr__,SpirVAssembly *this,NumberType type)

{
  allocator<char> *__a;
  int iVar1;
  char *__s;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  iVar1 = (int)this;
  if (iVar1 == 2) {
    __s = "float";
    __a = &local_b;
  }
  else if (iVar1 == 1) {
    __s = "uint";
    __a = &local_a;
  }
  else if (iVar1 == 0) {
    __s = "int";
    __a = &local_9;
  }
  else {
    __s = "";
    __a = &local_c;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

const string getNumberTypeName (const NumberType type)
{
	if (type == TYPE_INT)
	{
		return "int";
	}
	else if (type == TYPE_UINT)
	{
		return "uint";
	}
	else if (type == TYPE_FLOAT)
	{
		return "float";
	}
	else
	{
		DE_ASSERT(false);
		return "";
	}
}